

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_writer.c
# Opt level: O3

dtl_error_t dtl_json_writer_write_dv(dtl_json_writer_t *self,dtl_dv_t *dv,_Bool indentEnable)

{
  char cVar1;
  int iVar2;
  dtl_error_t extraout_EAX;
  uint uVar3;
  undefined8 in_RAX;
  ulong uVar4;
  ulong uVar5;
  dtl_dv_t *pdVar6;
  undefined8 uVar7;
  char *pcVar8;
  int iVar9;
  char *__format;
  FILE *__stream;
  adt_str_t *paVar10;
  char buf [64];
  char local_7d;
  int local_7c;
  char local_78 [72];
  
  uVar4 = CONCAT71((int7)((ulong)in_RAX >> 8),self == (dtl_json_writer_t *)0x0);
  if (dv == (dtl_dv_t *)0x0 || self == (dtl_json_writer_t *)0x0) goto switchD_00102ef8_caseD_2;
  uVar4 = dtl_dv_type(dv);
  iVar2 = (int)uVar4;
  if (iVar2 == 4) {
    uVar5 = dtl_hv_keys(dv);
    uVar4 = uVar5;
    if ((uVar5 != 0) &&
       ((self->sortKeys != true || (uVar4 = dtl_av_sort(uVar5,0,0), (int)uVar4 == 0)))) {
      iVar2 = dtl_av_length(uVar5);
      if (indentEnable) {
        dtl_json_writer_write_indent_str(self);
        dtl_json_writer_print(self,"{");
      }
      else {
        dtl_json_writer_putc(self,'{');
      }
      if (0 < iVar2) {
        dtl_json_writer_increaseIndent(self);
        if (self->currentIndent == 0) {
          iVar9 = 0;
          do {
            local_78[0] = '\0';
            uVar7 = dtl_av_value(uVar5,iVar9);
            pcVar8 = (char *)dtl_sv_to_cstr(uVar7,local_78);
            if (local_78[0] == '\x01') {
              if (iVar9 != 0) {
                dtl_json_writer_print(self,", ");
              }
              dtl_json_writer_putc(self,'\"');
              dtl_json_writer_print(self,pcVar8);
              dtl_json_writer_print(self,"\": ");
              pdVar6 = (dtl_dv_t *)dtl_hv_get_cstr(dv,pcVar8);
              dtl_json_writer_write_dv(self,pdVar6,true);
            }
            iVar9 = iVar9 + 1;
          } while (iVar2 != iVar9);
        }
        else {
          dtl_json_writer_print(self,self->newLineStr);
          local_7c = iVar2 + -1;
          iVar9 = 0;
          do {
            local_78[0] = '\0';
            uVar7 = dtl_av_value(uVar5,iVar9);
            pcVar8 = (char *)dtl_sv_to_cstr(uVar7,local_78);
            if (local_78[0] == '\x01') {
              dtl_json_writer_write_indent_str(self);
              dtl_json_writer_putc(self,'\"');
              dtl_json_writer_print(self,pcVar8);
              dtl_json_writer_print(self,"\": ");
              pdVar6 = (dtl_dv_t *)dtl_hv_get_cstr(dv,pcVar8);
              dtl_json_writer_write_dv(self,pdVar6,false);
              if (iVar9 < local_7c) {
                dtl_json_writer_print(self,",");
              }
              dtl_json_writer_print(self,self->newLineStr);
            }
            iVar9 = iVar9 + 1;
          } while (iVar2 != iVar9);
        }
        dtl_json_writer_decreaseIndent(self);
      }
      dtl_json_writer_write_indent_str(self);
      dtl_json_writer_print(self,"}");
      uVar4 = dtl_dv_dec_ref(uVar5);
    }
    goto switchD_00102ef8_caseD_2;
  }
  if (iVar2 == 3) {
    iVar2 = dtl_av_length(dv);
    if (indentEnable) {
      dtl_json_writer_write_indent_str(self);
      dtl_json_writer_print(self,"[");
    }
    else {
      dtl_json_writer_putc(self,'[');
    }
    if (0 < iVar2) {
      dtl_json_writer_increaseIndent(self);
      if (self->currentIndent == 0) {
        iVar9 = 0;
        do {
          pdVar6 = (dtl_dv_t *)dtl_av_value(dv,iVar9);
          if (iVar9 != 0) {
            dtl_json_writer_print(self,", ");
          }
          if (pdVar6 == (dtl_dv_t *)0x0) {
            dtl_json_writer_print(self,"NULL");
          }
          else {
            dtl_json_writer_write_dv(self,pdVar6,true);
          }
          iVar9 = iVar9 + 1;
        } while (iVar2 != iVar9);
      }
      else {
        dtl_json_writer_print(self,self->newLineStr);
        iVar9 = 0;
        do {
          pdVar6 = (dtl_dv_t *)dtl_av_value(dv,iVar9);
          if (pdVar6 != (dtl_dv_t *)0x0) {
            dtl_json_writer_write_dv(self,pdVar6,true);
          }
          if (iVar9 < iVar2 + -1) {
            dtl_json_writer_print(self,",");
          }
          dtl_json_writer_print(self,self->newLineStr);
          iVar9 = iVar9 + 1;
        } while (iVar2 != iVar9);
      }
      dtl_json_writer_decreaseIndent(self);
    }
    dtl_json_writer_write_indent_str(self);
    dtl_json_writer_print(self,"]");
    return extraout_EAX;
  }
  if (iVar2 != 2) goto switchD_00102ef8_caseD_2;
  local_7d = '\0';
  if (indentEnable) {
    dtl_json_writer_write_indent_str(self);
  }
  iVar2 = dtl_sv_type(dv);
  uVar5 = (ulong)(iVar2 - 1U);
  uVar4 = uVar5;
  if (8 < iVar2 - 1U) goto switchD_00102ef8_caseD_2;
  uVar4 = (long)&switchD_00102ef8::switchdataD_00104138 +
          (long)(int)(&switchD_00102ef8::switchdataD_00104138)[uVar5];
  switch(uVar5) {
  case 0:
    uVar4 = dtl_sv_to_i32(dv,0);
    __stream = (FILE *)self->destFile;
    __format = "%d";
    break;
  case 1:
    uVar4 = dtl_sv_to_u32(dv,0);
    __stream = (FILE *)self->destFile;
    __format = "%u";
    break;
  default:
    goto switchD_00102ef8_caseD_2;
  case 7:
    cVar1 = dtl_sv_to_bool(dv,0);
    pcVar8 = "false";
    if (cVar1 != '\0') {
      pcVar8 = "true";
    }
    if ((FILE *)self->destFile != (FILE *)0x0) {
      uVar3 = fputs(pcVar8,(FILE *)self->destFile);
      uVar4 = (ulong)uVar3;
      goto switchD_00102ef8_caseD_2;
    }
    paVar10 = self->destStr;
    goto LAB_001032ed;
  case 8:
    uVar4 = dtl_sv_to_cstr(dv,&local_7d);
    if (local_7d == '\x01') {
      if (uVar4 == 0) {
        __assert_fail("val.str != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_writer.c"
                      ,0x149,
                      "dtl_error_t dtl_json_writer_write_sv(dtl_json_writer_t *, const dtl_sv_t *, _Bool)"
                     );
      }
      if ((FILE *)self->destFile == (FILE *)0x0) {
        adt_str_push(self->destStr,0x22);
        adt_str_append_cstr(self->destStr,uVar4);
        uVar4 = adt_str_push(self->destStr,0x22);
      }
      else {
        uVar3 = fprintf((FILE *)self->destFile,"\"%s\"",uVar4);
        uVar4 = (ulong)uVar3;
      }
    }
    goto switchD_00102ef8_caseD_2;
  }
  if (__stream == (FILE *)0x0) {
    pcVar8 = local_78;
    sprintf(pcVar8,__format,uVar4 & 0xffffffff);
    paVar10 = self->destStr;
LAB_001032ed:
    uVar4 = adt_str_append_cstr(paVar10,pcVar8);
  }
  else {
    uVar3 = fprintf(__stream,__format,uVar4 & 0xffffffff);
    uVar4 = (ulong)uVar3;
  }
switchD_00102ef8_caseD_2:
  return (dtl_error_t)uVar4;
}

Assistant:

static dtl_error_t dtl_json_writer_write_dv(dtl_json_writer_t *self, const dtl_dv_t *dv, bool indentEnable)
{
   if ( (self != 0) && (dv != 0) )
   {
      switch (dtl_dv_type(dv))
      {
      case DTL_DV_INVALID:
         break;
      case DTL_DV_NULL:
         break;
      case DTL_DV_SCALAR:
         dtl_json_writer_write_sv(self, (const dtl_sv_t*) dv, indentEnable);
         break;
      case DTL_DV_ARRAY:
         dtl_json_writer_write_av(self, (const dtl_av_t*) dv, indentEnable);
         break;
      case DTL_DV_HASH:
         dtl_json_writer_write_hv(self, (const dtl_hv_t*) dv, indentEnable);
         break;
      default:
         break;
      }
      return DTL_NO_ERROR;
   }
   return DTL_INVALID_ARGUMENT_ERROR;
}